

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O2

bool __thiscall PolicyPureVector::Increment(PolicyPureVector *this)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  Interface_ProblemToPolicyDiscretePure *pIVar4;
  undefined4 extraout_var;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type __n;
  bool bVar6;
  
  pIVar4 = PolicyDiscretePure::GetInterfacePTPDiscretePure(&this->super_PolicyDiscretePure);
  iVar2 = (*(pIVar4->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[4])
                    (pIVar4,(ulong)*(uint *)&(this->super_PolicyDiscretePure).super_PolicyDiscrete.
                                             field_0x34);
  pIVar4 = PolicyDiscretePure::GetInterfacePTPDiscretePure(&this->super_PolicyDiscretePure);
  iVar3 = (*(pIVar4->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[5])
                    (pIVar4,(ulong)*(uint *)&(this->super_PolicyDiscretePure).super_PolicyDiscrete.
                                             field_0x34,
                     (ulong)(this->super_PolicyDiscretePure).super_PolicyDiscrete._m_indexDomCat,
                     (this->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy._m_depth);
  __n = (size_type)(iVar3 - 1);
  this_00 = &this->_m_domainToActionIndices;
  bVar6 = true;
  do {
    if (!bVar6) {
      return false;
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,__n);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,__n);
    *pvVar5 = (value_type)((ulong)(vVar1 + 1) % CONCAT44(extraout_var,iVar2));
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,__n);
    bVar6 = *pvVar5 == 0;
    __n = __n - 1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return bVar6;
}

Assistant:

bool PolicyPureVector::Increment()
{
    bool carry_over = true;
    size_t nrA = GetInterfacePTPDiscretePure()->GetNrActions(_m_agentI);
    size_t nrOH = GetInterfacePTPDiscretePure()->
        GetNrPolicyDomainElements(_m_agentI, GetPolicyDomainCategory(),
                                  GetDepth());

    //i is an integer index counting from nrObservationHistories-1 (=the last
    // observation history) to 0
    //(corresponding to the first (empty) observation sequence.
    Index i = nrOH - 1;
    while(carry_over)
    {
        _m_domainToActionIndices.at(i) = (_m_domainToActionIndices.at(i) + 1) % nrA;
        carry_over = (_m_domainToActionIndices.at(i) == 0);
        if(i > 0)
            i--;
        else
            break;
    }
    return(carry_over);
}